

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
::
List_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<int,std::allocator<int>>>
          (List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          vector<int,_std::allocator<int>_> *rowContainer,Column_settings *colSettings)

{
  uint uVar1;
  pointer puVar2;
  undefined8 *puVar3;
  uint *puVar4;
  pointer puVar5;
  _Self __tmp;
  undefined8 *puVar6;
  allocator_type local_39;
  List_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)0,false,false,false>>>
  *local_38;
  
  std::__cxx11::
  list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
  ::list((list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)0,_false,_false,_false>_>_>_*>_>
          *)this,(long)(nonZeroRowIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(nonZeroRowIndices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2,&local_39);
  *(undefined8 *)(this + 0x18) = 0;
  *(Column_settings **)(this + 0x20) = colSettings;
  puVar2 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar6 = *(undefined8 **)this;
  local_38 = this;
  for (puVar5 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    uVar1 = *puVar5;
    puVar3 = (undefined8 *)*puVar6;
    puVar4 = (uint *)operator_new(4);
    *puVar4 = uVar1;
    puVar6[2] = puVar4;
    puVar6 = puVar3;
  }
  return;
}

Assistant:

inline List_column<Master_matrix>::List_column(Index columnIndex,
                                               const Container& nonZeroRowIndices,
                                               Row_container* rowContainer,
                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size()),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  auto it = column_.begin();
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, it++);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, it++);
    }
  }
}